

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void nn_term(void)

{
  int local_c;
  int i;
  
  if (self.inited != 0) {
    nn_mutex_lock(&self.lock);
    self.flags = self.flags | 2;
    nn_mutex_unlock(&self.lock);
    for (local_c = 0; local_c < 0x200; local_c = local_c + 1) {
      nn_close(local_c);
    }
    nn_mutex_lock(&self.lock);
    self.flags = self.flags & 0xfffffffdU | 1;
    nn_condvar_broadcast(&self.cond);
    nn_mutex_unlock(&self.lock);
  }
  return;
}

Assistant:

void nn_term (void)
{
    int i;

    if (!self.inited) {
        return;
    }

    nn_mutex_lock (&self.lock);
    self.flags |= NN_CTX_FLAG_TERMING;
    nn_mutex_unlock (&self.lock);

    /* Make sure we really close resources, this will cause global
       resources to be freed too when the last socket is closed. */
    for (i = 0; i < NN_MAX_SOCKETS; i++) {
        (void) nn_close (i);
    }

    nn_mutex_lock (&self.lock);
    self.flags |= NN_CTX_FLAG_TERMED;
    self.flags &= ~NN_CTX_FLAG_TERMING;
    nn_condvar_broadcast(&self.cond);
    nn_mutex_unlock (&self.lock);
}